

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mktime.c
# Opt level: O0

time_t mktime(tm *__tp)

{
  time_t tVar1;
  time_t t;
  tm *timeptr_local;
  
  mtx_lock(&_PDCLIB_time_mtx);
  _PDCLIB_tzset_unlocked();
  tVar1 = _PDCLIB_mktime_tzname(&_PDCLIB_lclmem,(tm *)__tp,true);
  mtx_unlock(&_PDCLIB_time_mtx);
  return tVar1;
}

Assistant:

time_t mktime( struct tm * timeptr )
{
    time_t t;
    _PDCLIB_LOCK( _PDCLIB_time_mtx );
    _PDCLIB_tzset_unlocked();
    t = _PDCLIB_mktime_tzname( &_PDCLIB_lclmem, timeptr, true );
    _PDCLIB_UNLOCK( _PDCLIB_time_mtx );
    return t;
}